

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

bool __thiscall duckdb_shell::ShellState::OpenDatabase(ShellState *this,char **azArg,idx_t nArg)

{
  byte *pbVar1;
  string *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  idx_t iVar6;
  char *pcVar7;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (safe_mode == '\x01') {
    OpenDatabase();
    bVar2 = false;
  }
  else {
    close_db(this->db);
    this->db = (sqlite3 *)0x0;
    globalDb = (sqlite3 *)0x0;
    local_48 = 0;
    local_40[0] = 0;
    this_00 = &this->zDbFilename;
    local_50 = local_40;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    this->openMode = '\0';
    pbVar1 = (byte *)((long)&this->openFlags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    this->szMax = 0;
    if (nArg < 2) {
      bVar2 = true;
      bVar3 = false;
    }
    else {
      iVar6 = 1;
      bVar3 = false;
      do {
        pcVar5 = azArg[iVar6];
        if (*pcVar5 != '-') break;
        if (pcVar5[1] == '-') {
          pcVar7 = pcVar5 + 2;
        }
        else {
          pcVar7 = pcVar5 + 1;
        }
        iVar4 = strcmp(pcVar7,"new");
        bVar2 = true;
        if (iVar4 == 0) {
          bVar3 = true;
        }
        else {
          if (pcVar5[1] == '-') {
            pcVar7 = pcVar5 + 2;
          }
          else {
            pcVar7 = pcVar5 + 1;
          }
          iVar4 = strcmp(pcVar7,"readonly");
          if (iVar4 == 0) {
            this->openMode = '\x04';
          }
          else {
            if (pcVar5[1] == '-') {
              pcVar7 = pcVar5 + 2;
            }
            else {
              pcVar7 = pcVar5 + 1;
            }
            iVar4 = strcmp(pcVar7,"nofollow");
            if (iVar4 == 0) {
              pbVar1 = (byte *)((long)&this->openFlags + 3);
              *pbVar1 = *pbVar1 | 1;
            }
            else {
              bVar2 = false;
              fprintf(_stderr,"unknown option: %s\n",pcVar5);
            }
          }
        }
        if (!bVar2) {
          bVar2 = false;
          goto LAB_0021750e;
        }
        iVar6 = iVar6 + 1;
      } while (nArg != iVar6);
      bVar2 = true;
    }
LAB_0021750e:
    if (bVar2) {
      if (nArg < 2) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = duckdb_shell_sqlite3_mprintf("%s");
      }
      if ((pcVar5 != (char *)0x0) || (this->openMode == '\x06')) {
        if (bVar3) {
          unlink(pcVar5);
        }
        pcVar7 = (char *)(this->zDbFilename)._M_string_length;
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar7,(ulong)pcVar5);
        duckdb_shell_sqlite3_free(pcVar5);
        OpenDB(this,1);
        if (this->db == (sqlite3 *)0x0) {
          fprintf(_stderr,"Error: cannot open \'%s\'\n",pcVar5);
        }
      }
      if (this->db == (sqlite3 *)0x0) {
        local_48 = 0;
        local_40[0] = 0;
        local_50 = local_40;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        OpenDB(this,0);
      }
    }
  }
  return bVar2;
}

Assistant:

bool ShellState::OpenDatabase(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".open cannot be used in -safe mode\n");
		return false;
	}
	char *zNewFilename;   /* Name of the database file to open */
	idx_t iName = 1;      /* Index in azArg[] of the filename */
	bool newFlag = false; /* True to delete file before opening */
	/* Close the existing database */
	close_db(db);
	db = nullptr;
	globalDb = nullptr;
	zDbFilename = string();
	openMode = SHELL_OPEN_UNSPEC;
	openFlags = openFlags & ~(SQLITE_OPEN_NOFOLLOW); // don't overwrite settings loaded in the command line
	szMax = 0;
	/* Check for command-line arguments */
	for (idx_t iName = 1; iName < nArg && azArg[iName][0] == '-'; iName++) {
		const char *z = azArg[iName];
		if (optionMatch(z, "new")) {
			newFlag = true;
		} else if (optionMatch(z, "readonly")) {
			openMode = SHELL_OPEN_READONLY;
		} else if (optionMatch(z, "nofollow")) {
			openFlags |= SQLITE_OPEN_NOFOLLOW;
		} else if (z[0] == '-') {
			utf8_printf(stderr, "unknown option: %s\n", z);
			return false;
		}
	}
	/* If a filename is specified, try to open it first */
	zNewFilename = nArg > iName ? sqlite3_mprintf("%s", azArg[iName]) : 0;
	if (zNewFilename || openMode == SHELL_OPEN_HEXDB) {
		if (newFlag) {
			shellDeleteFile(zNewFilename);
		}
		zDbFilename = zNewFilename;
		sqlite3_free(zNewFilename);
		OpenDB(OPEN_DB_KEEPALIVE);
		if (!db) {
			utf8_printf(stderr, "Error: cannot open '%s'\n", zNewFilename);
		}
	}
	if (!db) {
		/* As a fall-back open a TEMP database */
		zDbFilename = string();
		OpenDB(0);
	}
	return true;
}